

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctime_tests.c
# Opt level: O1

int main(void)

{
  int ret_1;
  unsigned_long _zzq_result_30;
  unsigned_long _zzq_result_20;
  uchar ellswift [64];
  unsigned_long _zzq_args [6];
  unsigned_long _zzq_result;
  size_t outputlen;
  size_t siglen;
  uchar key [32];
  uchar msg [32];
  int ret;
  secp256k1_pubkey pubkey;
  uchar spubkey [33];
  
  main_cold_19();
  return 1;
}

Assistant:

int main(void) {
    secp256k1_context* ctx;
    unsigned char key[32];
    int ret, i;

    if (!SECP256K1_CHECKMEM_RUNNING()) {
        fprintf(stderr, "This test can only usefully be run inside valgrind because it was not compiled under msan.\n");
        fprintf(stderr, "Usage: libtool --mode=execute valgrind ./ctime_tests\n");
        return 1;
    }
    ctx = secp256k1_context_create(SECP256K1_CONTEXT_DECLASSIFY);
    /** In theory, testing with a single secret input should be sufficient:
     *  If control flow depended on secrets the tool would generate an error.
     */
    for (i = 0; i < 32; i++) {
        key[i] = i + 65;
    }

    run_tests(ctx, key);

    /* Test context randomisation. Do this last because it leaves the context
     * tainted. */
    SECP256K1_CHECKMEM_UNDEFINE(key, 32);
    ret = secp256k1_context_randomize(ctx, key);
    SECP256K1_CHECKMEM_DEFINE(&ret, sizeof(ret));
    CHECK(ret);

    secp256k1_context_destroy(ctx);
    return 0;
}